

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

void RandWalk(shared_ptr<MWakler> *walker)

{
  element_type *peVar1;
  pointer pMVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  Mrect r;
  
  peVar1 = (walker->super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pMVar2 = (peVar1->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((peVar1->mRects).super__Vector_base<Mrect,_std::allocator<Mrect>_>._M_impl.
      super__Vector_impl_data._M_start == pMVar2) {
    iVar7 = rand();
    iVar8 = rand();
    r.y1 = iVar8 % 100 + 10;
    r.x1 = iVar7 % 100 + 10;
    r.y2 = iVar8 % 100 + 0x32;
    r.x2 = iVar7 % 100 + 0x32;
    peVar1 = (walker->super___shared_ptr<MWakler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  else {
    uVar3 = pMVar2[-1].x1;
    uVar4 = pMVar2[-1].y1;
    uVar5 = pMVar2[-1].x2;
    uVar6 = pMVar2[-1].y2;
    fVar9 = (peVar1->mSpeed).sX;
    fVar10 = (peVar1->mSpeed).sY;
    r.y1 = (int)((float)(int)uVar4 + fVar10);
    r.x1 = (int)((float)(int)uVar3 + fVar9);
    r.y2 = (int)((float)(int)uVar6 + fVar10);
    r.x2 = (int)((float)(int)uVar5 + fVar9);
  }
  std::vector<Mrect,_std::allocator<Mrect>_>::push_back(&peVar1->mRects,&r);
  return;
}

Assistant:

inline void RandWalk(std::shared_ptr<MWakler> walker)
{
    if(walker->mRects.empty())
    {
        int randX = std::rand() % 100;
        int randY = std::rand() % 100;

        Mrect r{10 + randX,10 + randY,50 + randX,50 + randY};
        walker->mRects.push_back(r);
        return ;
    }

    Mrect r = walker->mRects.back();
    r.x1 += walker->mSpeed.sX;
    r.x2 += walker->mSpeed.sX;
    r.y1 += walker->mSpeed.sY;
    r.y2 += walker->mSpeed.sY;
    walker->mRects.push_back(r);
    return;
}